

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O2

void __thiscall
mocker::nasm::Section::
emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::MemoryAddr>,std::shared_ptr<mocker::nasm::Register>const&>
          (Section *this,shared_ptr<mocker::nasm::MemoryAddr> *args,
          shared_ptr<mocker::nasm::Register> *args_1)

{
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  emplaceLine<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::MemoryAddr>,std::shared_ptr<mocker::nasm::Register>const&>
            (this,&local_40,args,args_1);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void emplaceInst(Args &&... args) {
    emplaceLine<Type>("", std::forward<Args>(args)...);
  }